

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

int VerifyRSA::sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  ulong uVar2;
  RSA *rsa;
  uchar *Msg;
  size_t MsgLen;
  size_t local_40;
  size_t encMessageLength;
  char *base64Text;
  uchar *encMessage;
  RSA *privateRSA;
  string *plainText_local;
  string *privateKey_local;
  
  privateRSA = (RSA *)sig;
  plainText_local = (string *)ctx;
  lVar1 = std::__cxx11::string::find((char *)ctx,0x103000);
  if ((lVar1 == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    rsa = createPrivateRSA((string *)ctx);
    encMessage = (uchar *)rsa;
    Msg = (uchar *)std::__cxx11::string::c_str();
    MsgLen = std::__cxx11::string::length();
    RSASign(rsa,Msg,MsgLen,(uchar **)&base64Text,&local_40);
    Base64Encode((uchar *)base64Text,local_40,(char **)&encMessageLength);
    free(base64Text);
    return (int)encMessageLength;
  }
  return 0;
}

Assistant:

char *VerifyRSA::sign(std::string privateKey, std::string plainText)
{
    if (privateKey.find("-----BEGIN RSA PRIVATE KEY-----",0)!=0 ||
        plainText.empty())
    {
        return NULL;
    }
    RSA* privateRSA = createPrivateRSA(privateKey);
    unsigned char* encMessage;
    char* base64Text;
    size_t encMessageLength;
    RSASign(privateRSA, (unsigned char*)plainText.c_str(), plainText.length(), &encMessage, &encMessageLength);
    Base64Encode(encMessage, encMessageLength, &base64Text);
    free(encMessage);
    return base64Text;
}